

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int xmlCharEncInFunc(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  int iVar1;
  uint uVar2;
  int written;
  int toconv;
  
  if (in == (xmlBufferPtr)0x0 ||
      (out == (xmlBufferPtr)0x0 || handler == (xmlCharEncodingHandler *)0x0)) {
    iVar1 = -1;
  }
  else {
    toconv = in->use;
    if (toconv == 0) {
      iVar1 = 0;
    }
    else {
      uVar2 = out->use;
      written = ~uVar2 + out->size;
      if (written <= toconv * 2) {
        xmlBufferGrow(out,out->size + toconv * 2);
        uVar2 = out->use;
        written = ~uVar2 + out->size;
      }
      iVar1 = xmlEncInputChunk(handler,out->content + uVar2,&written,in->content,&toconv);
      xmlBufferShrink(in,toconv);
      uVar2 = out->use + written;
      out->use = uVar2;
      out->content[uVar2] = '\0';
      if (written != 0) {
        iVar1 = written;
      }
    }
  }
  return iVar1;
}

Assistant:

int
xmlCharEncInFunc(xmlCharEncodingHandler * handler, xmlBufferPtr out,
                 xmlBufferPtr in)
{
    int ret;
    int written;
    int toconv;

    if (handler == NULL)
        return(XML_ENC_ERR_INTERNAL);
    if (out == NULL)
        return(XML_ENC_ERR_INTERNAL);
    if (in == NULL)
        return(XML_ENC_ERR_INTERNAL);

    toconv = in->use;
    if (toconv == 0)
        return (0);
    written = out->size - out->use -1; /* count '\0' */
    if (toconv * 2 >= written) {
        xmlBufferGrow(out, out->size + toconv * 2);
        written = out->size - out->use - 1;
    }
    ret = xmlEncInputChunk(handler, &out->content[out->use], &written,
                           in->content, &toconv);
    xmlBufferShrink(in, toconv);
    out->use += written;
    out->content[out->use] = 0;

    return (written? written : ret);
}